

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_00;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_01;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_02;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_03;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_04;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_05;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_06;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_07;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_08;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_09;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_10;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __last;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __last_00;
  anon_class_8_1_8991fb9c comp_00;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var4;
  difference_type dVar5;
  FractionalInteger *pFVar6;
  int in_ECX;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_RDX;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_RSI;
  FractionalInteger *in_RDI;
  undefined1 in_R8B;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar7;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  pivot_pos;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  byte bVar8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcf0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd08;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd10;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd18;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd20;
  FractionalInteger *in_stack_fffffffffffffd28;
  FractionalInteger *in_stack_fffffffffffffd30;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd40;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd48;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd50;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd58;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd80;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd88;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd90;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_118 [2];
  FractionalInteger *local_108;
  FractionalInteger *local_100;
  FractionalInteger *local_f8;
  FractionalInteger *local_f0;
  FractionalInteger *local_e8;
  FractionalInteger *local_d8;
  FractionalInteger *local_d0;
  FractionalInteger *local_c8;
  FractionalInteger *local_b8;
  FractionalInteger *local_b0;
  FractionalInteger *local_a8;
  FractionalInteger *local_98;
  FractionalInteger *local_90;
  FractionalInteger *local_88;
  FractionalInteger *local_78;
  FractionalInteger *local_70;
  FractionalInteger *local_68;
  long local_60;
  FractionalInteger *local_48;
  FractionalInteger *local_30;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar9;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_8;
  
  uVar9 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  local_8._M_current = in_RDI;
  do {
    while( true ) {
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_fffffffffffffcd0._M_current,
                         (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      if (dVar3 < 0x18) {
        if ((uVar9 & 0x1000000) == 0) {
          local_48 = local_8._M_current;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                    (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd40._M_current);
        }
        else {
          local_30 = local_8._M_current;
          insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                    (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd40._M_current);
        }
        return;
      }
      local_60 = dVar3 / 2;
      if (dVar3 < 0x81) {
        local_f8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_100 = local_8._M_current;
        local_108 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
      }
      else {
        local_68 = local_8._M_current;
        local_70 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_78 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_88 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_90 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_98 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_a8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_c8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_e8 = local_8._M_current;
        local_f0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        _Var4._M_current._7_1_ = in_stack_fffffffffffffccf;
        _Var4._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,_Var4);
      }
      bVar8 = 0;
      if ((uVar9 & 0x1000000) == 0) {
        local_118[0] = __gnu_cxx::
                       __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                   in_stack_fffffffffffffcd0._M_current);
        in_stack_fffffffffffffce0.this =
             (HighsTableauSeparator *)
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator*(local_118);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(&local_8);
        bVar1 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd30,
                           in_stack_fffffffffffffd28,in_stack_fffffffffffffd20._M_current);
        bVar8 = bVar1 ^ 0xff;
      }
      if ((bVar8 & 1) == 0) break;
      partition_left<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                 (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd48._M_current);
      local_8 = __gnu_cxx::
                __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                            in_stack_fffffffffffffcd0._M_current);
    }
    pVar7 = partition_right<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd80._M_current);
    _Var4 = pVar7.first._M_current;
    dVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                        *)in_stack_fffffffffffffcd0._M_current,
                       (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                        *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    __gnu_cxx::
    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                (difference_type)in_stack_fffffffffffffcd0._M_current);
    pFVar6 = (FractionalInteger *)
             __gnu_cxx::operator-
                       (in_stack_fffffffffffffcd0._M_current,
                        (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    bVar1 = dVar3 / 8 <= dVar5;
    if (bVar1) {
      in_stack_fffffffffffffcd0._M_current = pFVar6;
    }
    bVar1 = !bVar1;
    bVar2 = (long)pFVar6 < dVar3 / 8;
    in_stack_fffffffffffffcdf = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      in_ECX = in_ECX + -1;
      if (in_ECX == 0) {
        __last._M_current._7_1_ = bVar8;
        __last._M_current._0_7_ = in_stack_fffffffffffffce8;
        std::
        make_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffcf0,__last,in_stack_fffffffffffffce0);
        __last_00._M_current._7_1_ = bVar8;
        __last_00._M_current._0_7_ = in_stack_fffffffffffffce8;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (in_stack_fffffffffffffcf0,__last_00,in_stack_fffffffffffffce0);
        return;
      }
      if (0x17 < dVar5) {
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,__b);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_00._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_00._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,__b_00);
        if (0x80 < dVar5) {
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_01._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_01._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_01);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_02._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_02._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_02);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_03._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_03._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_03);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_04._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_04._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_04);
        }
      }
      if (0x17 < (long)pFVar6) {
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        in_stack_fffffffffffffd90 =
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                         in_stack_fffffffffffffcd0._M_current);
        __b_05._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_05._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,__b_05);
        in_stack_fffffffffffffd88 =
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                         in_stack_fffffffffffffcd0._M_current);
        in_stack_fffffffffffffd80 =
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                         in_stack_fffffffffffffcd0._M_current);
        __b_06._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_06._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffcd0,__b_06);
        if (0x80 < (long)pFVar6) {
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_07._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_07._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_07);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_08._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_08._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_08);
          in_stack_fffffffffffffd58 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          in_stack_fffffffffffffd50 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          __b_09._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_09._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_09);
          in_stack_fffffffffffffd48 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          in_stack_fffffffffffffd40 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          __b_10._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_10._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffcd0,__b_10);
        }
      }
    }
    else {
      bVar1 = false;
      pFVar6 = in_RDX._M_current;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                          (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                           (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd48._M_current);
        bVar1 = false;
        in_stack_fffffffffffffd28 = in_RDX._M_current;
        in_stack_fffffffffffffd30 = _Var4._M_current;
        if (bVar2) {
          in_stack_fffffffffffffd10._M_current = pFVar6;
          in_stack_fffffffffffffd18._M_current = in_RSI._M_current;
          in_stack_fffffffffffffd20 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          pFVar6 = in_stack_fffffffffffffd10._M_current;
          in_RSI._M_current = in_stack_fffffffffffffd18._M_current;
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                             (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd48._M_current);
          in_stack_fffffffffffffd28 = in_RDX._M_current;
          in_stack_fffffffffffffd30 = _Var4._M_current;
        }
      }
      in_RDX._M_current = pFVar6;
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffccf = 0;
    }
    comp_00.this._4_4_ = in_ECX;
    comp_00.this._0_4_ = uVar9;
    in_stack_fffffffffffffd08._M_current = local_8._M_current;
    pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
              (in_RSI,in_RDX,comp_00,(int)((ulong)dVar3 >> 0x20),SUB81((ulong)dVar3 >> 0x18,0));
    in_stack_fffffffffffffcf0 =
         __gnu_cxx::
         __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
         ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd0._M_current);
    uVar9 = uVar9 & 0xffffff;
    local_8 = in_stack_fffffffffffffcf0;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }